

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *specialFunctions)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int line;
  pointer pFVar1;
  pointer pRVar2;
  pointer pNVar3;
  pointer pEVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  __type_conflict _Var8;
  iterator iVar9;
  pointer __rhs;
  pointer pEVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command;
  pointer pRVar11;
  pointer pbVar12;
  string *psVar13;
  pointer pNVar14;
  VulkanHppGenerator *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command_1;
  string handleProtect;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
  local_138;
  string leave;
  string local_d0;
  string enter;
  string titleProtect;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  listedCommands;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  listedCommands._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &listedCommands._M_t._M_impl.super__Rb_tree_header._M_header;
  listedCommands._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  listedCommands._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  listedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(handle->second).commands;
  this_01 = &(handle->second).secondLevelCommands;
  listedCommands._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       listedCommands._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__rhs = (this->m_features).
               super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pFVar1; __rhs = __rhs + 1) {
    firstLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    secondLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    firstLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    firstLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    secondLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    secondLevelCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pRVar2 = (__rhs->requireData).
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar11 = (__rhs->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar2;
        pRVar11 = pRVar11 + 1) {
      pNVar3 = (pRVar11->commands).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pNVar14 = (pRVar11->commands).
                     super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     ._M_impl.super__Vector_impl_data._M_start; pNVar14 != pNVar3;
          pNVar14 = pNVar14 + 1) {
        bVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::contains(specialFunctions,&pNVar14->name);
        if (!bVar7) {
          bVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::contains(this_00,&pNVar14->name);
          if (bVar7) {
            bVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                    ::contains(&listedCommands,&pNVar14->name);
            if (bVar7) {
              __assert_fail("!listedCommands.contains( command.name )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x236e,
                            "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                           );
            }
            std::__cxx11::string::string((string *)&handleProtect,&__rhs->name);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                      (&local_138,&pNVar14->name,(NameLine *)&handleProtect);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                        *)&listedCommands,&local_138);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::~pair(&local_138);
            std::__cxx11::string::~string((string *)&handleProtect);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&firstLevelCommands,&pNVar14->name);
          }
          else {
            bVar7 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::contains(this_01,&pNVar14->name);
            if (bVar7) {
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                      ::find(&listedCommands._M_t,&pNVar14->name);
              if ((_Rb_tree_header *)iVar9._M_node ==
                  &listedCommands._M_t._M_impl.super__Rb_tree_header) {
                std::__cxx11::string::string((string *)&handleProtect,&__rhs->name);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_138,&pNVar14->name,(NameLine *)&handleProtect);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&listedCommands,&local_138);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::~pair(&local_138);
                std::__cxx11::string::~string((string *)&handleProtect);
                if ((handle->first)._M_string_length == 0) {
                  __assert_fail("!handle.first.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x2378,
                                "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                               );
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&secondLevelCommands,&pNVar14->name);
              }
              else {
                _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(iVar9._M_node + 2),&__rhs->name);
                line = pNVar14->xmlLine;
                std::operator+(&leave,"command <",&pNVar14->name);
                std::operator+(&enter,&leave,"> already listed as required for feature <");
                std::operator+(&titleProtect,&enter,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (iVar9._M_node + 2));
                std::operator+(&handleProtect,&titleProtect,"> on line ");
                std::__cxx11::to_string(&local_d0,iVar9._M_node[3]._M_color);
                std::operator+(&local_138.first,&handleProtect,&local_d0);
                checkForError(_Var8,line,&local_138.first);
                std::__cxx11::string::~string((string *)&local_138);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&handleProtect);
                std::__cxx11::string::~string((string *)&titleProtect);
                std::__cxx11::string::~string((string *)&enter);
                std::__cxx11::string::~string((string *)&leave);
              }
            }
          }
        }
      }
    }
    if ((firstLevelCommands.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         firstLevelCommands.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (secondLevelCommands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        secondLevelCommands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::operator+(&handleProtect,"\n  //=== ",&__rhs->name);
      std::operator+(&local_138.first,&handleProtect," ===\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_138.first);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&handleProtect);
      pbVar6 = firstLevelCommands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = firstLevelCommands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = secondLevelCommands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          psVar13 = secondLevelCommands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar12 != pbVar6;
          pbVar12 = pbVar12 + 1) {
        generateRAIIHandleCommand
                  (&local_138.first,this,pbVar12,(ulong)((handle->first)._M_string_length != 0),
                   false);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_138.first);
        std::__cxx11::string::~string((string *)&local_138);
      }
      for (; psVar13 != pbVar5; psVar13 = psVar13 + 1) {
        if ((handle->first)._M_string_length == 0) {
          __assert_fail("!handle.first.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x238f,
                        "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                       );
        }
        generateRAIIHandleCommand(&local_138.first,this,psVar13,2,false);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_138.first);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&secondLevelCommands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&firstLevelCommands);
  }
  pEVar10 = (this->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar10 == pEVar4) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
      ::~_Rb_tree(&listedCommands._M_t);
      return __return_storage_ptr__;
    }
    firstLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    firstLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    firstLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    secondLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    secondLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    secondLevelCommands_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pRVar2 = (pEVar10->requireData).
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar13 = &pEVar10->name;
    for (pRVar11 = (pEVar10->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar2;
        pRVar11 = pRVar11 + 1) {
      pNVar3 = (pRVar11->commands).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pNVar14 = (pRVar11->commands).
                     super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     ._M_impl.super__Vector_impl_data._M_start; pNVar14 != pNVar3;
          pNVar14 = pNVar14 + 1) {
        bVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::contains(specialFunctions,&pNVar14->name);
        if ((!bVar7) &&
           (bVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                    ::contains(&listedCommands,&pNVar14->name), !bVar7)) {
          bVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::contains(this_00,&pNVar14->name);
          if (bVar7) {
            std::__cxx11::string::string((string *)&handleProtect,psVar13);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                      (&local_138,&pNVar14->name,(NameLine *)&handleProtect);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                        *)&listedCommands,&local_138);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::~pair(&local_138);
            std::__cxx11::string::~string((string *)&handleProtect);
            this_03 = &firstLevelCommands_1;
          }
          else {
            bVar7 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::contains(this_01,&pNVar14->name);
            if (!bVar7) goto LAB_0015570f;
            std::__cxx11::string::string((string *)&handleProtect,psVar13);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                      (&local_138,&pNVar14->name,(NameLine *)&handleProtect);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                        *)&listedCommands,&local_138);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
            ::~pair(&local_138);
            std::__cxx11::string::~string((string *)&handleProtect);
            this_03 = &secondLevelCommands_1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_03,&pNVar14->name);
        }
LAB_0015570f:
      }
    }
    if ((firstLevelCommands_1.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         firstLevelCommands_1.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (secondLevelCommands_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        secondLevelCommands_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      getProtectFromType(&handleProtect,this,&handle->first);
      getProtectFromTitle(&titleProtect,this,psVar13);
      enter._M_dataplus._M_p = (pointer)&enter.field_2;
      enter._M_string_length = 0;
      leave._M_dataplus._M_p = (pointer)&leave.field_2;
      leave._M_string_length = 0;
      enter.field_2._M_local_buf[0] = '\0';
      leave.field_2._M_local_buf[0] = '\0';
      if ((titleProtect._M_string_length != 0) &&
         (this_02 = (VulkanHppGenerator *)&handleProtect,
         _Var8 = std::operator==(&titleProtect,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&handleProtect), !_Var8)) {
        generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_138,this_02,&titleProtect,true);
        local_d0._M_dataplus._M_p = (pointer)&leave;
        local_d0._M_string_length = (size_type)&enter;
        std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                  ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_d0,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_138);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_138);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &secondLevelCommands,"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enter);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &firstLevelCommands,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &secondLevelCommands,"  //=== ");
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &firstLevelCommands,psVar13);
      std::operator+(&local_138.first,&local_d0," ===\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_138.first);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&firstLevelCommands);
      std::__cxx11::string::~string((string *)&secondLevelCommands);
      pbVar6 = firstLevelCommands_1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = firstLevelCommands_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = secondLevelCommands_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          psVar13 = secondLevelCommands_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar12 != pbVar6;
          pbVar12 = pbVar12 + 1) {
        generateRAIIHandleCommand
                  (&local_138.first,this,pbVar12,(ulong)((handle->first)._M_string_length != 0),
                   false);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_138.first);
        std::__cxx11::string::~string((string *)&local_138);
      }
      for (; psVar13 != pbVar5; psVar13 = psVar13 + 1) {
        if ((handle->first)._M_string_length == 0) {
          __assert_fail("!handle.first.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x23bb,
                        "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                       );
        }
        generateRAIIHandleCommand(&local_138.first,this,psVar13,2,false);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_138.first);
        std::__cxx11::string::~string((string *)&local_138);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&leave);
      std::__cxx11::string::~string((string *)&leave);
      std::__cxx11::string::~string((string *)&enter);
      std::__cxx11::string::~string((string *)&titleProtect);
      std::__cxx11::string::~string((string *)&handleProtect);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&secondLevelCommands_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&firstLevelCommands_1);
    pEVar10 = pEVar10 + 1;
  } while( true );
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations( std::pair<std::string, HandleData> const & handle,
                                                                       std::set<std::string> const &              specialFunctions ) const
{
  std::string                     functionDeclarations;
  std::map<std::string, NameLine> listedCommands;  // some commands are listed with more than one extension !
  for ( auto const & feature : m_features )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;

    for ( auto const & require : feature.requireData )
    {
      for ( auto const & command : require.commands )
      {
        if ( !specialFunctions.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            assert( !listedCommands.contains( command.name ) );
            listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            auto listedIt = listedCommands.find( command.name );
            if ( listedIt == listedCommands.end() )
            {
              listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
              assert( !handle.first.empty() );
              secondLevelCommands.push_back( command.name );
            }
            else
            {
              checkForError( listedIt->second.name == feature.name,
                             command.xmlLine,
                             "command <" + command.name + "> already listed as required for feature <" + listedIt->second.name + "> on line " +
                               std::to_string( listedIt->second.xmlLine ) );
            }
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      functionDeclarations += "\n  //=== " + feature.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
    }
  }

  for ( auto const & extension : m_extensions )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;
    for ( auto & req : extension.requireData )
    {
      for ( auto const & command : req.commands )
      {
        if ( !specialFunctions.contains( command.name ) && !listedCommands.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            secondLevelCommands.push_back( command.name );
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      std::string handleProtect = getProtectFromType( handle.first );
      std::string titleProtect  = getProtectFromTitle( extension.name );
      std::string enter, leave;
      if ( !titleProtect.empty() && ( titleProtect != handleProtect ) )
      {
        std::tie( enter, leave ) = generateProtection( titleProtect );
      }
      functionDeclarations += "\n" + enter + "  //=== " + extension.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
      functionDeclarations += leave;
    }
  }
  return functionDeclarations;
}